

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O1

TypeDescriptor * equalToOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  pointer pcVar1;
  int iVar2;
  NumberDescriptor *pNVar3;
  ostream *poVar4;
  double value;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if (leftValue->_type == STRING) {
    if (rightValue->_type == STRING) {
      pNVar3 = (NumberDescriptor *)operator_new(0x60);
      pcVar1 = (leftValue->_string)._M_dataplus._M_p;
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (leftValue->_string)._M_string_length);
      pcVar1 = (rightValue->_string)._M_dataplus._M_p;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + (rightValue->_string)._M_string_length);
      value = 0.0;
      if (local_38 == local_58) {
        if ((local_38 == 0) || (iVar2 = bcmp(local_40,local_60,local_38), iVar2 == 0)) {
          value = 1.0;
        }
        else {
          value = 0.0;
        }
      }
      NumberDescriptor::NumberDescriptor(pNVar3,value);
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      return &pNVar3->super_TypeDescriptor;
    }
  }
  else if ((leftValue->_type == NUMBER) && (rightValue->_type == NUMBER)) {
    pNVar3 = (NumberDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor
              (pNVar3,(double)(-(ulong)(rightValue->_number == leftValue->_number) &
                              0x3ff0000000000000));
    return &pNVar3->super_TypeDescriptor;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(2);
}

Assistant:

TypeDescriptor *equalToOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numEqual = new  NumberDescriptor(leftValue->getNumber() == rightValue->getNumber() ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *equalToOperator: " << leftValue->getNumber() << " == " << rightValue->getNumber() << std::endl;
        return numEqual;
    }else if(leftValue->type() == TypeDescriptor::STRING
    && rightValue->type() == TypeDescriptor::STRING ){
        auto *stringEqual = new  NumberDescriptor(leftValue->getString()  == rightValue->getString()  ? 1.0 : 0.0);
        //std::cout << "TypeDescriptor *equalToOperator: " << leftValue->getString()  << " == " << rightValue->getString()  << std::endl;
        return stringEqual;
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}